

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

MCTOOLS_FILE_t * mctools_fopen(mcu8str *rawpath,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  char *in_RSI;
  MCTOOLS_FILE_t *fh;
  mcu8str pathcopy;
  char buf [4096];
  mcu8str path;
  mcu8str *in_stack_ffffffffffffefb0;
  mcu8str *in_stack_ffffffffffffefb8;
  mcu8str *in_stack_ffffffffffffefc0;
  mcu8str local_30;
  char *local_18;
  FILE *local_8;
  
  local_18 = in_RSI;
  mctools_impl_view_no_winnamespace(in_stack_ffffffffffffefb0);
  iVar1 = mcu8str_contains(&local_30,'\\');
  if (iVar1 == 0) {
    local_8 = fopen(local_30.c_str,local_18);
  }
  else {
    mcu8str_create_from_staticbuffer
              ((char *)in_stack_ffffffffffffefc0,(mcu8str_size_t)in_stack_ffffffffffffefb8);
    mcu8str_assign(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
    mctools_pathseps_platform(in_stack_ffffffffffffefb0);
    pFVar2 = fopen((char *)in_stack_ffffffffffffefb0,local_18);
    mcu8str_dealloc(in_stack_ffffffffffffefb0);
    local_8 = pFVar2;
  }
  return (MCTOOLS_FILE_t *)local_8;
}

Assistant:

MCTOOLS_FILE_t * mctools_fopen( const mcu8str* rawpath,
                                  const char * mode )
  {
    mcu8str path = mctools_impl_view_no_winnamespace( rawpath );

    //Utf8-encoded paths are used directly on platforms except Windows, where
    //only ASCII encoded paths can be used directly. We also run paths through
    //mctools_pathseps_platform.
#ifdef MC_IS_WINDOWS
    //Ok, non-ASCII path on windows. Reencode as wide strings and use _wfopen:
    mcwinstr wpath = mc_path2wpath( &path );//this also maps to native path sep
    char buf[32];
    mcu8str mcu8str_mode = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_append_cstr(&mcu8str_mode,mode);
    mcwinstr wmode = mc_u8str_to_winstr( &mcu8str_mode );
    //    MCTOOLS_FILE_t * result = _wfopen( wpath.c_str, wmode.c_str );//nb: no STDNS here on purpose
    MCTOOLS_FILE_t * result = NULL;
    errno_t errno_result = _wfopen_s( &result, wpath.c_str, wmode.c_str );
    mcu8str_dealloc(&mcu8str_mode);
    mc_winstr_dealloc( &wpath );
    mc_winstr_dealloc( &wmode );
    if ( errno_result != 0 ) {
      if ( result )
        fclose(result);//a bit weird, but most likely we won't get here.
      return NULL;
    }
    return result;
#else
    if ( !mcu8str_contains( &path, '\\' ) ) {
      //Usual case on unix -> no extra work needed
      return STDNS fopen( path.c_str, mode );
    } else {
      //Copy path so we can run it through mctools_pathseps_platform:
      char buf[4096];
      mcu8str pathcopy = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
      mcu8str_assign( &pathcopy, &path );
      mctools_pathseps_platform( &pathcopy );
      MCTOOLS_FILE_t * fh = STDNS fopen( pathcopy.c_str, mode );
      mcu8str_dealloc(&pathcopy);
      return fh;
    }
#endif
  }